

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

stb_vorbis * stb_vorbis_open_filename(char *filename,int *error,stb_vorbis_alloc *alloc)

{
  FAudioIOStream *file;
  stb_vorbis *psVar1;
  
  file = FAudio_fopen(filename);
  if (file != (FAudioIOStream *)0x0) {
    psVar1 = stb_vorbis_open_file(file,1,error,alloc);
    return psVar1;
  }
  if (error != (int *)0x0) {
    *error = 6;
  }
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_filename(const char *filename, int *error, const stb_vorbis_alloc *alloc)
{
   FILE *f;
#if defined(_WIN32) && defined(__STDC_WANT_SECURE_LIB__)
   if (0 != fopen_s(&f, filename, "rb"))
      f = NULL;
#else
   f = fopen(filename, "rb");
#endif
   if (f)
      return stb_vorbis_open_file(f, TRUE, error, alloc);
   if (error) *error = VORBIS_file_open_failure;
   return NULL;
}